

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::POMDPXState>::Free
          (MemoryPool<despot::POMDPXState> *this,POMDPXState *obj)

{
  pointer *pppPVar1;
  iterator __position;
  POMDPXState *local_10;
  
  local_10 = obj;
  if ((obj->super_State).super_MemoryObject.allocated_ != false) {
    (obj->super_State).super_MemoryObject.allocated_ = false;
    __position._M_current =
         (this->freelist_).
         super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->freelist_).
        super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<despot::POMDPXState*,std::allocator<despot::POMDPXState*>>::
      _M_realloc_insert<despot::POMDPXState*const&>
                ((vector<despot::POMDPXState*,std::allocator<despot::POMDPXState*>> *)
                 &this->freelist_,__position,&local_10);
    }
    else {
      *__position._M_current = obj;
      pppPVar1 = &(this->freelist_).
                  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::POMDPXState>::Free(T *) [T = despot::POMDPXState]")
  ;
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}